

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_def_read
                   (Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *nread,
                   _Bool *eos)

{
  _Bool *eos_local;
  size_t *nread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  if (reader->next == (Curl_creader *)0x0) {
    *nread = 0;
    *eos = false;
    data_local._4_4_ = CURLE_READ_ERROR;
  }
  else {
    data_local._4_4_ = (*reader->next->crt->do_read)(data,reader->next,buf,blen,nread,eos);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_creader_def_read(struct Curl_easy *data,
                               struct Curl_creader *reader,
                               char *buf, size_t blen,
                               size_t *nread, bool *eos)
{
  if(reader->next)
    return reader->next->crt->do_read(data, reader->next, buf, blen,
                                      nread, eos);
  else {
    *nread = 0;
    *eos = FALSE;
    return CURLE_READ_ERROR;
  }
}